

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

int xOctaveInit(OctaveNoise *noise,Xoroshiro *xr,PerlinNoise *octaves,double *amplitudes,int omin,
               int len,int nmax)

{
  ulong uVar1;
  uint64_t *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t l;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  Xoroshiro pxr;
  Xoroshiro local_40;
  
  dVar9 = xOctaveInit::lacuna_ini[-omin];
  uVar1 = xr->lo;
  uVar8 = xr->hi;
  uVar4 = uVar8 ^ uVar1;
  uVar6 = uVar4 << 0x15 ^ (uVar1 << 0x31 | uVar1 >> 0xf) ^ uVar4;
  uVar5 = uVar4 << 0x1c | uVar4 >> 0x24;
  dVar10 = xOctaveInit::persist_ini[len];
  uVar4 = uVar6 ^ uVar5;
  xr->lo = uVar4 << 0x15 ^ (uVar6 << 0x31 | uVar6 >> 0xf) ^ uVar4;
  xr->hi = uVar4 << 0x1c | uVar4 >> 0x24;
  iVar3 = 0;
  if (nmax != 0 && 0 < len) {
    uVar8 = uVar8 + uVar1;
    uVar5 = uVar5 + uVar6;
    puVar2 = xOctaveInit::md5_octave_n[omin + 0xc] + 1;
    iVar3 = 0;
    lVar7 = 1;
    do {
      if ((amplitudes[lVar7 + -1] != 0.0) || (NAN(amplitudes[lVar7 + -1]))) {
        local_40.lo = (*(uint64_t (*) [2])(puVar2 + -1))[0] ^
                      (uVar8 * 0x20000 | uVar8 >> 0x2f) + uVar1;
        local_40.hi = *puVar2 ^ (uVar5 * 0x20000 | uVar5 >> 0x2f) + uVar6;
        xPerlinInit(octaves + iVar3,&local_40);
        octaves[iVar3].amplitude = amplitudes[lVar7 + -1] * dVar10;
        octaves[iVar3].lacunarity = dVar9;
        iVar3 = iVar3 + 1;
      }
      dVar10 = dVar10 * 0.5;
      if (len <= lVar7) break;
      dVar9 = dVar9 + dVar9;
      puVar2 = puVar2 + 2;
      lVar7 = lVar7 + 1;
    } while (iVar3 != nmax);
  }
  noise->octaves = octaves;
  noise->octcnt = iVar3;
  return iVar3;
}

Assistant:

int xOctaveInit(OctaveNoise *noise, Xoroshiro *xr, PerlinNoise *octaves,
        const double *amplitudes, int omin, int len, int nmax)
{
    static const uint64_t md5_octave_n[][2] = {
        {0xb198de63a8012672, 0x7b84cad43ef7b5a8}, // md5 "octave_-12"
        {0x0fd787bfbc403ec3, 0x74a4a31ca21b48b8}, // md5 "octave_-11"
        {0x36d326eed40efeb2, 0x5be9ce18223c636a}, // md5 "octave_-10"
        {0x082fe255f8be6631, 0x4e96119e22dedc81}, // md5 "octave_-9"
        {0x0ef68ec68504005e, 0x48b6bf93a2789640}, // md5 "octave_-8"
        {0xf11268128982754f, 0x257a1d670430b0aa}, // md5 "octave_-7"
        {0xe51c98ce7d1de664, 0x5f9478a733040c45}, // md5 "octave_-6"
        {0x6d7b49e7e429850a, 0x2e3063c622a24777}, // md5 "octave_-5"
        {0xbd90d5377ba1b762, 0xc07317d419a7548d}, // md5 "octave_-4"
        {0x53d39c6752dac858, 0xbcd1c5a80ab65b3e}, // md5 "octave_-3"
        {0xb4a24d7a84e7677b, 0x023ff9668e89b5c4}, // md5 "octave_-2"
        {0xdffa22b534c5f608, 0xb9b67517d3665ca9}, // md5 "octave_-1"
        {0xd50708086cef4d7c, 0x6e1651ecc7f43309}, // md5 "octave_0"
    };
    static const double lacuna_ini[] = { // -omin = 3..12
        1, .5, .25, 1./8, 1./16, 1./32, 1./64, 1./128, 1./256, 1./512, 1./1024,
        1./2048, 1./4096,
    };
    static const double persist_ini[] = { // len = 4..9
        0, 1, 2./3, 4./7, 8./15, 16./31, 32./63, 64./127, 128./255, 256./511,
    };
#if DEBUG
    if (-omin < 0 || -omin >= (int) (sizeof(lacuna_ini)/sizeof(double)) ||
        len < 0 || len >= (int) (sizeof(persist_ini)/sizeof(double)))
    {
        printf("Fatal: octave initialization out of range\n");
        exit(1);
    }
#endif
    double lacuna = lacuna_ini[-omin];
    double persist = persist_ini[len];
    uint64_t xlo = xNextLong(xr);
    uint64_t xhi = xNextLong(xr);
    int i = 0, n = 0;

    for (; i < len && n != nmax; i++, lacuna *= 2.0, persist *= 0.5)
    {
        if (amplitudes[i] == 0)
            continue;
        Xoroshiro pxr;
        pxr.lo = xlo ^ md5_octave_n[12 + omin + i][0];
        pxr.hi = xhi ^ md5_octave_n[12 + omin + i][1];
        xPerlinInit(&octaves[n], &pxr);
        octaves[n].amplitude = amplitudes[i] * persist;
        octaves[n].lacunarity = lacuna;
        n++;
    }

    noise->octaves = octaves;
    noise->octcnt = n;
    return n;
}